

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::DoTrackMergedValueForKills
          (GlobOpt *this,Value *value,GlobOptBlockData *blockData,
          BVSparse<Memory::JitArenaAllocator> *mergedValueTypesTrackedForKills)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ValueNumber i;
  undefined4 *puVar5;
  ValueInfo *valueInfo_00;
  ArrayValueInfo *this_00;
  StackSym *pSVar6;
  bool isVirtualTypedArray;
  bool isJsArray;
  ValueInfo *valueInfo;
  BVSparse<Memory::JitArenaAllocator> *mergedValueTypesTrackedForKills_local;
  GlobOptBlockData *blockData_local;
  Value *value_local;
  GlobOpt *this_local;
  
  blockData_local = (GlobOptBlockData *)value;
  value_local = (Value *)this;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32d3,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (blockData == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32d4,"(blockData)","blockData");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  valueInfo_00 = ::Value::GetValueInfo((Value *)blockData_local);
  bVar2 = ValueType::IsAnyOptimizedArray(&valueInfo_00->super_ValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32d7,"(valueInfo->IsAnyOptimizedArray())",
                       "valueInfo->IsAnyOptimizedArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = ValueType::IsArrayOrObjectWithArray(&valueInfo_00->super_ValueType);
  bVar3 = ValueType::IsOptimizedTypedArray(&valueInfo_00->super_ValueType);
  if ((bool)((bVar2 ^ 0xffU) & 1) != bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32da,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                       "!isJsArray == valueInfo->IsOptimizedTypedArray()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = ValueType::IsOptimizedVirtualTypedArray(&valueInfo_00->super_ValueType);
  VerifyArrayValueInfoForTracking(this,valueInfo_00,bVar2,this->currentBlock,true);
  if ((!bVar2) && (!bVar3)) {
    bVar2 = ValueInfo::IsArrayValueInfo(valueInfo_00);
    if (!bVar2) {
      return;
    }
    this_00 = ValueInfo::AsArrayValueInfo(valueInfo_00);
    pSVar6 = ArrayValueInfo::HeadSegmentLengthSym(this_00);
    if (pSVar6 == (StackSym *)0x0) {
      return;
    }
  }
  if (mergedValueTypesTrackedForKills != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    i = ::Value::GetValueNumber((Value *)blockData_local);
    BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndSet(mergedValueTypesTrackedForKills,i);
    if (BVar4 != '\0') {
      return;
    }
  }
  JsUtil::
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Add(blockData->valuesToKillOnCalls,(Value **)&blockData_local);
  return;
}

Assistant:

void
GlobOpt::DoTrackMergedValueForKills(
    Value *const value,
    GlobOptBlockData *const blockData,
    BVSparse<JitArenaAllocator> *const mergedValueTypesTrackedForKills) const
{
    Assert(value);
    Assert(blockData);

    ValueInfo *valueInfo = value->GetValueInfo();
    Assert(valueInfo->IsAnyOptimizedArray());

    const bool isJsArray = valueInfo->IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());

    const bool isVirtualTypedArray = valueInfo->IsOptimizedVirtualTypedArray();

#if DBG
    VerifyArrayValueInfoForTracking(valueInfo, isJsArray, currentBlock, true);
#endif

    if(!isJsArray && !isVirtualTypedArray && !(valueInfo->IsArrayValueInfo() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()))
    {
        return;
    }

    // Can't assume going forward that it will definitely be an array without disabling implicit calls, because the
    // array may be transformed into an ES5 array. Since array opts are enabled, implicit calls can be disabled, and we can
    // treat it as a definite value type going forward, but the value needs to be tracked so that something like a call can
    // revert the value type to a likely version.
    if(!mergedValueTypesTrackedForKills || !mergedValueTypesTrackedForKills->TestAndSet(value->GetValueNumber()))
    {
        blockData->valuesToKillOnCalls->Add(value);
    }
}